

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O0

void Abc_NtkTestTimByWritingFile(Gia_Man_t *pGia,char *pFileName)

{
  int iVar1;
  Gia_Man_t *p;
  Gia_Man_t *pGia2;
  char *pFileName_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Gia_ManHasChoices(pGia);
  if (iVar1 != 0) {
    Gia_ManVerifyChoices(pGia);
    Gia_ManReverseClasses(pGia,0);
  }
  Gia_AigerWrite(pGia,pFileName,0,0);
  iVar1 = Gia_ManHasChoices(pGia);
  if (iVar1 != 0) {
    Gia_ManReverseClasses(pGia,1);
  }
  p = Gia_AigerRead(pFileName,1,1);
  iVar1 = Gia_ManHasChoices(p);
  if (iVar1 != 0) {
    Gia_ManVerifyChoices(p);
    Gia_ManReverseClasses(p,1);
  }
  iVar1 = Gia_ManCompare(pGia,p);
  if (iVar1 != 0) {
    printf("Verification suceessful.\n");
  }
  Gia_ManStop(p);
  return;
}

Assistant:

void Abc_NtkTestTimByWritingFile( Gia_Man_t * pGia, char * pFileName )
{
    Gia_Man_t * pGia2;

    // normalize choices
    if ( Gia_ManHasChoices(pGia) )
    {
        Gia_ManVerifyChoices( pGia );
        Gia_ManReverseClasses( pGia, 0 );
    }
    // write file
    Gia_AigerWrite( pGia, pFileName, 0, 0 );
    // unnormalize choices
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManReverseClasses( pGia, 1 );

    // read file
    pGia2 = Gia_AigerRead( pFileName, 1, 1 );

    // normalize choices
    if ( Gia_ManHasChoices(pGia2) )
    {
        Gia_ManVerifyChoices( pGia2 );
        Gia_ManReverseClasses( pGia2, 1 );
    }

    // compare resulting managers
    if ( Gia_ManCompare( pGia, pGia2 ) )
        printf( "Verification suceessful.\n" );

    Gia_ManStop( pGia2 );
}